

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

int mpc_nodecount_unretained(mpc_parser_t *p,int force)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  int total;
  int i;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  undefined4 local_4;
  
  if ((*(char *)(in_RDI + 0x31) == '\0') || (in_ESI != 0)) {
    if (*(char *)(in_RDI + 0x30) == '\x05') {
      local_4 = mpc_nodecount_unretained
                          ((mpc_parser_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                           in_stack_ffffffffffffffe4);
      local_4 = local_4 + 1;
    }
    else if (*(char *)(in_RDI + 0x30) == '\x0f') {
      local_4 = mpc_nodecount_unretained
                          ((mpc_parser_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                           in_stack_ffffffffffffffe4);
      local_4 = local_4 + 1;
    }
    else if (*(char *)(in_RDI + 0x30) == '\x10') {
      local_4 = mpc_nodecount_unretained
                          ((mpc_parser_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                           in_stack_ffffffffffffffe4);
      local_4 = local_4 + 1;
    }
    else if (*(char *)(in_RDI + 0x30) == '\x11') {
      local_4 = mpc_nodecount_unretained
                          ((mpc_parser_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                           in_stack_ffffffffffffffe4);
      local_4 = local_4 + 1;
    }
    else if (*(char *)(in_RDI + 0x30) == '\x19') {
      local_4 = mpc_nodecount_unretained
                          ((mpc_parser_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                           in_stack_ffffffffffffffe4);
      local_4 = local_4 + 1;
    }
    else if (*(char *)(in_RDI + 0x30) == '\x1a') {
      local_4 = mpc_nodecount_unretained
                          ((mpc_parser_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                           in_stack_ffffffffffffffe4);
      local_4 = local_4 + 1;
    }
    else if (*(char *)(in_RDI + 0x30) == '\x12') {
      local_4 = mpc_nodecount_unretained
                          ((mpc_parser_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                           in_stack_ffffffffffffffe4);
      local_4 = local_4 + 1;
    }
    else if (*(char *)(in_RDI + 0x30) == '\x13') {
      local_4 = mpc_nodecount_unretained
                          ((mpc_parser_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                           in_stack_ffffffffffffffe4);
      local_4 = local_4 + 1;
    }
    else if (*(char *)(in_RDI + 0x30) == '\x14') {
      local_4 = mpc_nodecount_unretained
                          ((mpc_parser_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                           in_stack_ffffffffffffffe4);
      local_4 = local_4 + 1;
    }
    else if (*(char *)(in_RDI + 0x30) == '\x15') {
      local_4 = mpc_nodecount_unretained
                          ((mpc_parser_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                           in_stack_ffffffffffffffe4);
      local_4 = local_4 + 1;
    }
    else if (*(char *)(in_RDI + 0x30) == '\x16') {
      local_4 = mpc_nodecount_unretained
                          ((mpc_parser_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                           in_stack_ffffffffffffffe4);
      local_4 = local_4 + 1;
    }
    else if (*(char *)(in_RDI + 0x30) == '\x17') {
      local_4 = 1;
      for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 8); iVar2 = iVar2 + 1) {
        iVar1 = mpc_nodecount_unretained((mpc_parser_t *)CONCAT44(in_ESI,iVar2),local_4);
        local_4 = iVar1 + local_4;
      }
    }
    else if (*(char *)(in_RDI + 0x30) == '\x18') {
      local_4 = 1;
      for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 8); iVar2 = iVar2 + 1) {
        iVar1 = mpc_nodecount_unretained((mpc_parser_t *)CONCAT44(in_ESI,iVar2),local_4);
        local_4 = iVar1 + local_4;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int mpc_nodecount_unretained(mpc_parser_t* p, int force) {

  int i, total;

  if (p->retained && !force) { return 0; }

  if (p->type == MPC_TYPE_EXPECT) { return 1 + mpc_nodecount_unretained(p->data.expect.x, 0); }

  if (p->type == MPC_TYPE_APPLY)    { return 1 + mpc_nodecount_unretained(p->data.apply.x, 0); }
  if (p->type == MPC_TYPE_APPLY_TO) { return 1 + mpc_nodecount_unretained(p->data.apply_to.x, 0); }
  if (p->type == MPC_TYPE_PREDICT)  { return 1 + mpc_nodecount_unretained(p->data.predict.x, 0); }

  if (p->type == MPC_TYPE_CHECK)    { return 1 + mpc_nodecount_unretained(p->data.check.x, 0); }
  if (p->type == MPC_TYPE_CHECK_WITH) { return 1 + mpc_nodecount_unretained(p->data.check_with.x, 0); }

  if (p->type == MPC_TYPE_NOT)   { return 1 + mpc_nodecount_unretained(p->data.not.x, 0); }
  if (p->type == MPC_TYPE_MAYBE) { return 1 + mpc_nodecount_unretained(p->data.not.x, 0); }

  if (p->type == MPC_TYPE_MANY)  { return 1 + mpc_nodecount_unretained(p->data.repeat.x, 0); }
  if (p->type == MPC_TYPE_MANY1) { return 1 + mpc_nodecount_unretained(p->data.repeat.x, 0); }
  if (p->type == MPC_TYPE_COUNT) { return 1 + mpc_nodecount_unretained(p->data.repeat.x, 0); }

  if (p->type == MPC_TYPE_OR) {
    total = 1;
    for(i = 0; i < p->data.or.n; i++) {
      total += mpc_nodecount_unretained(p->data.or.xs[i], 0);
    }
    return total;
  }

  if (p->type == MPC_TYPE_AND) {
    total = 1;
    for(i = 0; i < p->data.and.n; i++) {
      total += mpc_nodecount_unretained(p->data.and.xs[i], 0);
    }
    return total;
  }

  return 1;

}